

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

t_operand __thiscall
xemmai::ast::t_literal<long>::f_emit
          (t_literal<long> *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_code *ptVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  undefined7 in_register_00000011;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar3;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  undefined8 uVar4;
  t_operand tVar5;
  void *local_28;
  
  aVar3.v_integer._1_7_ = in_register_00000011;
  aVar3.v_integer._0_1_ = a_tail;
  if ((int)CONCAT71(in_register_00000009,a_operand) == 0) {
    uVar4 = 4;
    if (!a_clear) {
      if (a_tail) {
        t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
        ptVar1 = a_emit->v_code;
        local_28 = t_code::v_labels[0x22];
      }
      else {
        local_28 = t_code::v_labels[0x1e];
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_28)
        ;
        ptVar1 = a_emit->v_code;
        local_28 = (void *)a_emit->v_stack;
      }
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&ptVar1->v_instructions,&local_28);
      local_28 = (void *)this->v_value;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_28);
      uVar2 = a_emit->v_stack + 1;
      a_emit->v_stack = uVar2;
      if (a_emit->v_code->v_size < uVar2) {
        a_emit->v_code->v_size = uVar2;
      }
      t_emit::f_at(a_emit,&this->super_t_node);
      aVar3 = extraout_RDX;
    }
  }
  else {
    aVar3 = (anon_union_8_4_0f1077ea_for_t_operand_2)this->v_value;
    uVar4 = 0;
  }
  tVar5.field_1.v_integer = aVar3.v_integer;
  tVar5._0_8_ = uVar4;
  return tVar5;
}

Assistant:

t_operand t_literal<T>::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	if (a_operand) return v_value;
	if (a_clear) return {};
	if (a_tail) {
		a_emit.f_emit_safe_point(this);
		a_emit << static_cast<t_instruction>(t_emit::f_instruction_of<T>() + c_instruction__RETURN_NUL - c_instruction__NUL) << v_value;
	} else {
		a_emit << t_emit::f_instruction_of<T>() << a_emit.v_stack << v_value;
	}
	a_emit.f_push();
	a_emit.f_at(this);
	return {};
}